

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

int despot::POMCP::Count(VNode *vnode)

{
  int iVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar2;
  QNode *this_00;
  undefined4 local_18;
  undefined4 local_14;
  ACT_TYPE action;
  int count;
  VNode *vnode_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    this = VNode::children(vnode);
    sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
    if (sVar2 <= (ulong)(long)local_18) break;
    this_00 = VNode::Child(vnode,local_18);
    iVar1 = QNode::count(this_00);
    local_14 = iVar1 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int POMCP::Count(const VNode* vnode) {
	int count = 0;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++)
		count += vnode->Child(action)->count();
	return count;
}